

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfdriver.c
# Opt level: O1

char * sfnt_get_ps_name(TT_Face face)

{
  FT_UInt FVar1;
  TT_NameRec *pTVar2;
  FT_Stream pFVar3;
  void *pvVar4;
  char cVar5;
  long lVar6;
  FT_Bool FVar7;
  uint uVar8;
  char *__s;
  size_t sVar9;
  FT_MM_Var *pFVar10;
  uint *puVar11;
  char *pcVar12;
  byte bVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  byte *pbVar22;
  long lVar23;
  int *piVar24;
  byte bVar25;
  byte *pbVar26;
  char *pcVar27;
  FT_Memory pFVar28;
  ulong uVar29;
  long lVar30;
  bool bVar31;
  undefined8 local_78;
  FT_Int win;
  uint local_6c [3];
  long lStack_60;
  FT_Error error;
  FT_MM_Var *mm_var;
  char *subfamily_name;
  FT_Int apple;
  uint local_3c;
  int local_38;
  FT_UInt num_coords;
  FT_Int win_1;
  FT_Int apple_1;
  
  if (face->postscript_name != (char *)0x0) {
    return face->postscript_name;
  }
  if ((face->blend == (GX_Blend)0x0) ||
     ((((face->root).face_index & 0x7fff0000) == 0 && (((face->root).face_flags & 0x8000) == 0)))) {
    FVar7 = sfnt_get_name_id(face,6,(FT_Int *)&local_78,(FT_Int *)&subfamily_name);
    if (FVar7 == '\0') {
      return (char *)0x0;
    }
    pFVar28 = (face->root).memory;
    pTVar2 = (face->name_table).names;
    pFVar3 = (face->name_table).stream;
    if ((long)(int)local_78 == -1) {
      __s = get_apple_string(pFVar28,pFVar3,pTVar2 + (int)subfamily_name,sfnt_is_postscript,'\x01');
    }
    else {
      __s = get_win_string(pFVar28,pFVar3,pTVar2 + (int)local_78,sfnt_is_postscript,'\x01');
    }
    goto LAB_00220db7;
  }
  pFVar28 = (face->root).memory;
  pvVar4 = face->mm;
  if (face->var_postscript_prefix == (char *)0x0) {
    FVar7 = sfnt_get_name_id(face,0x19,&local_38,(FT_Int *)&num_coords);
    if ((FVar7 == '\0') &&
       (FVar7 = sfnt_get_name_id(face,0x10,&local_38,(FT_Int *)&num_coords), FVar7 == '\0')) {
      FVar7 = sfnt_get_name_id(face,1,&local_38,(FT_Int *)&num_coords);
      bVar31 = FVar7 == '\0';
    }
    else {
      bVar31 = false;
    }
    if (bVar31) {
      __s = (char *)0x0;
    }
    else {
      pTVar2 = (face->name_table).names;
      pFVar3 = (face->name_table).stream;
      if ((long)local_38 == -1) {
        __s = get_apple_string(pFVar28,pFVar3,pTVar2 + (int)num_coords,sfnt_is_alphanumeric,'\0');
      }
      else {
        __s = get_win_string(pFVar28,pFVar3,pTVar2 + local_38,sfnt_is_alphanumeric,'\0');
      }
      sVar9 = strlen(__s);
      uVar8 = (uint)sVar9;
      if (0x5b < uVar8) {
        __s[0x5b] = '\0';
        uVar8 = 0x5b;
      }
      face->var_postscript_prefix = __s;
      face->var_postscript_prefix_len = uVar8;
    }
    if (!bVar31) goto LAB_00220565;
LAB_0022076a:
    __s = (char *)0x0;
  }
  else {
    __s = (char *)0x0;
LAB_00220565:
    (**(code **)((long)pvVar4 + 0x40))(face,&local_3c,&subfamily_name,0,&stack0xffffffffffffffa0);
    uVar29 = (face->root).face_index & 0x7fff0000;
    if ((uVar29 == 0) || (((face->root).face_flags & 0x8000) != 0)) {
LAB_00220737:
      lVar30 = *(long *)(lStack_60 + 0x10);
      __s = (char *)ft_mem_alloc(pFVar28,(ulong)(face->var_postscript_prefix_len + local_3c * 0x11 +
                                                1),(FT_Error *)(local_6c + 2));
      if (local_6c[2] != 0) goto LAB_0022076a;
      strcpy(__s,face->var_postscript_prefix);
      pbVar26 = (byte *)(__s + face->var_postscript_prefix_len);
      if (local_3c != 0) {
        uVar8 = 0;
        pbVar22 = pbVar26;
        do {
          pbVar26 = pbVar22;
          if (*(long *)subfamily_name != *(long *)(lVar30 + 0x10)) {
            pbVar26 = pbVar22 + 1;
            *pbVar22 = 0x5f;
            uVar14 = *(uint *)subfamily_name;
            if (uVar14 == 0) {
              pbVar22[1] = 0x30;
              pbVar26 = pbVar22 + 2;
            }
            else {
              if ((int)uVar14 < 0) {
                pbVar22[1] = 0x2d;
                pbVar26 = pbVar22 + 2;
                uVar14 = -uVar14;
              }
              pbVar22 = (byte *)&local_78;
              if (0xffff < uVar14) {
                uVar29 = (ulong)(uVar14 >> 0x10);
                do {
                  uVar18 = (uint)uVar29;
                  *pbVar22 = (char)uVar29 + (char)(uVar29 / 10) * -10 | 0x30;
                  pbVar22 = pbVar22 + 1;
                  uVar29 = uVar29 / 10;
                } while (9 < uVar18);
              }
              for (; &local_78 < pbVar22; pbVar22 = pbVar22 + -1) {
                *pbVar26 = pbVar22[-1];
                pbVar26 = pbVar26 + 1;
              }
              if ((uVar14 & 0xffff) != 0) {
                *pbVar26 = 0x2e;
                lVar6 = 0;
                uVar14 = (uVar14 & 0xffff) * 10 + 5;
                do {
                  uVar18 = uVar14;
                  lVar23 = lVar6;
                  cVar5 = (char)(uVar18 >> 0x10);
                  bVar25 = cVar5 + 0x30;
                  pbVar26[lVar23 + 1] = bVar25;
                  if ((uVar18 & 0xffff) == 0) {
                    uVar14 = 0;
                    break;
                  }
                  uVar14 = (uVar18 & 0xffff) * 10;
                  lVar6 = lVar23 + 1;
                } while ((int)(lVar23 + 1) != 5);
                pbVar26 = pbVar26 + lVar23 + 1;
                if (lVar23 == 4) {
                  bVar13 = 0x30;
                  if (0x542df < uVar14 || bVar25 != 0x31) {
                    if (((uVar18 >> 0x10 & 1) == 0 || uVar14 != 0x2a120) &&
                       (uVar18 < 0x10000 || 0x2a11f < uVar14)) goto LAB_002208f8;
                    bVar13 = cVar5 + 0x2f;
                  }
                  *pbVar26 = bVar13;
                }
LAB_002208f8:
                bVar25 = *pbVar26;
                while (bVar25 == 0x30) {
                  *pbVar26 = 0;
                  bVar25 = pbVar26[-1];
                  pbVar26 = pbVar26 + -1;
                }
                pbVar26 = pbVar26 + 1;
              }
            }
            bVar25 = *(byte *)(lVar30 + 0x23);
            if ((bVar25 != 0x20) &&
               (iVar19 = (int)(char)bVar25,
               iVar19 - 0x61U < 0x1a || (iVar19 - 0x41U < 0x1a || iVar19 - 0x30U < 10))) {
              *pbVar26 = bVar25;
              pbVar26 = pbVar26 + 1;
            }
            bVar25 = *(byte *)(lVar30 + 0x22);
            if ((bVar25 != 0x20) &&
               (iVar19 = (int)(char)bVar25,
               iVar19 - 0x61U < 0x1a || (iVar19 - 0x41U < 0x1a || iVar19 - 0x30U < 10))) {
              *pbVar26 = bVar25;
              pbVar26 = pbVar26 + 1;
            }
            bVar25 = *(byte *)(lVar30 + 0x21);
            if ((bVar25 != 0x20) &&
               (iVar19 = (int)(char)bVar25,
               iVar19 - 0x61U < 0x1a || (iVar19 - 0x41U < 0x1a || iVar19 - 0x30U < 10))) {
              *pbVar26 = bVar25;
              pbVar26 = pbVar26 + 1;
            }
            bVar25 = *(byte *)(lVar30 + 0x20);
            if ((bVar25 != 0x20) &&
               (iVar19 = (int)(char)bVar25,
               iVar19 - 0x61U < 0x1a || (iVar19 - 0x41U < 0x1a || iVar19 - 0x30U < 10))) {
              *pbVar26 = bVar25;
              pbVar26 = pbVar26 + 1;
            }
          }
          subfamily_name = subfamily_name + 8;
          uVar8 = uVar8 + 1;
          lVar30 = lVar30 + 0x30;
          pbVar22 = pbVar26;
        } while (uVar8 < local_3c);
      }
    }
    else {
      pbVar26 = (byte *)face->sfnt;
      lVar30 = ((uVar29 >> 0x10) - 1) * 0x10;
      uVar8 = *(uint *)(*(long *)(lStack_60 + 0x18) + 0xc + lVar30);
      local_78 = (char *)0x0;
      _apple = pFVar28;
      if (uVar8 == 6 || uVar8 - 0x100 < 0x7f00) {
        (**(code **)(pbVar26 + 0xe8))(face,uVar8 & 0xffff,&local_78);
      }
      pcVar27 = local_78;
      if (local_78 == (char *)0x0) {
        (**(code **)(pbVar26 + 0xe8))
                  (face,*(undefined2 *)(*(long *)(lStack_60 + 0x18) + 8 + lVar30),&mm_var);
        if (mm_var == (FT_MM_Var *)0x0) {
          iVar19 = 9;
        }
        else {
          FVar1 = face->var_postscript_prefix_len;
          sVar9 = strlen((char *)mm_var);
          __s = (char *)ft_mem_alloc(_apple,sVar9 + (FVar1 + 1) + 1,(FT_Error *)(local_6c + 2));
          if (local_6c[2] == 0) {
            strcpy(__s,face->var_postscript_prefix);
            pcVar27 = __s + (ulong)face->var_postscript_prefix_len + 1;
            __s[face->var_postscript_prefix_len] = '-';
            cVar5 = (char)mm_var->num_axis;
            pFVar10 = mm_var;
            while (cVar5 != '\0') {
              pFVar10 = (FT_MM_Var *)((long)&pFVar10->num_axis + 1);
              iVar19 = (int)cVar5;
              if (iVar19 - 0x61U < 0x1a || (iVar19 - 0x41U < 0x1a || iVar19 - 0x30U < 10)) {
                *pcVar27 = cVar5;
                pcVar27 = pcVar27 + 1;
              }
              cVar5 = (char)pFVar10->num_axis;
            }
            *pcVar27 = '\0';
            pbVar26 = (byte *)(pcVar27 + 1);
            ft_mem_free(_apple,mm_var);
            mm_var = (FT_MM_Var *)0x0;
            iVar19 = 0;
          }
          else {
            iVar19 = 1;
          }
        }
      }
      else {
        sVar9 = strlen(local_78);
        pbVar26 = (byte *)(pcVar27 + sVar9 + 1);
        iVar19 = 6;
        __s = pcVar27;
      }
      if ((iVar19 != 0) && (iVar19 != 6)) {
        pFVar28 = _apple;
        if (iVar19 != 9) goto LAB_0022076a;
        goto LAB_00220737;
      }
    }
    if (0x7f < (long)pbVar26 - (long)__s) {
      uVar8 = (uint)((long)pbVar26 - (long)__s);
      uVar14 = uVar8;
      if ((int)uVar8 < 0) {
        uVar14 = uVar8 + 0xf;
      }
      _apple = (FT_Memory)(long)(int)(uVar14 & 0xfffffff0);
      uVar18 = 0x75bcd15;
      uVar17 = 0x75bcd15;
      uVar16 = 0x75bcd15;
      uVar15 = 0x75bcd15;
      if (0x1e < uVar8 + 0xf) {
        lVar30 = (long)((int)uVar14 >> 4);
        piVar24 = (int *)(__s + (long)_apple + lVar30 * -0x10 + 0xc);
        uVar16 = 0x75bcd15;
        uVar17 = 0x75bcd15;
        uVar18 = 0x75bcd15;
        do {
          uVar15 = ((uint)(piVar24[-3] * 0x239b961b) >> 0x11 | piVar24[-3] * -0x34f28000) *
                   -0x54f16877 ^ uVar15;
          iVar19 = (uVar15 << 0x13 | uVar15 >> 0xd) + uVar16;
          uVar15 = iVar19 * 5 + 0x561ccd1b;
          uVar16 = ((uint)(piVar24[-2] * -0x54f16877) >> 0x10 | piVar24[-2] * -0x68770000) *
                   0x38b34ae5 ^ uVar16;
          uVar16 = ((uVar16 << 0x11 | uVar16 >> 0xf) + uVar17) * 5 + 0xbcaa747;
          uVar17 = ((uint)(piVar24[-1] * 0x38b34ae5) >> 0xf | piVar24[-1] * -0x6a360000) *
                   -0x5e1c746d ^ uVar17;
          uVar17 = ((uVar17 << 0xf | uVar17 >> 0x11) + uVar18) * 5 + 0x96cd1c35;
          uVar18 = ((uint)(*piVar24 * -0x5e1c746d) >> 0xe | *piVar24 * 0x2e4c0000) * 0x239b961b ^
                   uVar18;
          uVar18 = ((uVar18 << 0xd | uVar18 >> 0x13) + iVar19 * 5 + 0x561ccd1b) * 5 + 0x32ac3b17;
          piVar24 = piVar24 + 4;
          lVar30 = lVar30 + -1;
        } while (lVar30 != 0);
      }
      uVar20 = 0;
      uVar14 = 0;
      switch(uVar8 & 0xf) {
      case 0xf:
        uVar14 = (uint)(byte)__s[(long)_apple + 0xe] << 0x10;
      case 0xe:
        uVar14 = uVar14 | (uint)(byte)__s[(long)_apple + 0xd] << 8;
      case 0xd:
        uVar18 = uVar18 ^ (((byte)__s[(long)_apple + 0xc] ^ uVar14) * -0x5e1c746d >> 0xe |
                          ((byte)__s[(long)_apple + 0xc] ^ uVar14) * 0x2e4c0000) * 0x239b961b;
      case 0xc:
        uVar14 = (uint)(byte)__s[(long)_apple + 0xb] << 0x18;
      case 0xb:
        uVar14 = uVar14 | (uint)(byte)__s[(long)_apple + 10] << 0x10;
      case 10:
        uVar14 = uVar14 ^ (uint)(byte)__s[(long)_apple + 9] << 8;
      case 9:
        uVar17 = uVar17 ^ (((byte)__s[(long)_apple + 8] ^ uVar14) * 0x38b34ae5 >> 0xf |
                          ((byte)__s[(long)_apple + 8] ^ uVar14) * -0x6a360000) * -0x5e1c746d;
      case 8:
        uVar14 = (uint)(byte)__s[(long)_apple + 7] << 0x18;
      case 7:
        uVar14 = uVar14 | (uint)(byte)__s[(long)_apple + 6] << 0x10;
      case 6:
        uVar14 = uVar14 ^ (uint)(byte)__s[(long)_apple + 5] << 8;
      case 5:
        uVar16 = uVar16 ^ (((byte)__s[(long)_apple + 4] ^ uVar14) * -0x54f16877 >> 0x10 |
                          ((byte)__s[(long)_apple + 4] ^ uVar14) * -0x68770000) * 0x38b34ae5;
      case 4:
        uVar14 = (uint)(byte)__s[(long)_apple + 3] << 0x18;
      case 3:
        uVar20 = uVar14 | (uint)(byte)__s[(long)_apple + 2] << 0x10;
      case 2:
        uVar20 = uVar20 ^ (uint)(byte)__s[(long)_apple + 1] << 8;
      case 1:
        uVar15 = uVar15 ^ (((byte)__s[(long)_apple] ^ uVar20) * 0x239b961b >> 0x11 |
                          ((byte)__s[(long)_apple] ^ uVar20) * -0x34f28000) * -0x54f16877;
      case 0:
        uVar15 = (uVar15 ^ uVar8) + (uVar17 ^ uVar8) + (uVar16 ^ uVar8) + (uVar18 ^ uVar8);
        uVar16 = (uVar16 ^ uVar8) + uVar15;
        uVar14 = (uVar17 ^ uVar8) + uVar15;
        uVar8 = (uVar18 ^ uVar8) + uVar15;
        uVar18 = (uVar15 >> 0x10 ^ uVar15) * -0x7a143595;
        uVar17 = (uVar18 >> 0xd ^ uVar18) * -0x3d4d51cb;
        uVar18 = (uVar16 >> 0x10 ^ uVar16) * -0x7a143595;
        uVar18 = (uVar18 >> 0xd ^ uVar18) * -0x3d4d51cb;
        uVar18 = uVar18 >> 0x10 ^ uVar18;
        uVar14 = (uVar14 >> 0x10 ^ uVar14) * -0x7a143595;
        uVar14 = (uVar14 >> 0xd ^ uVar14) * -0x3d4d51cb;
        uVar14 = uVar14 >> 0x10 ^ uVar14;
        uVar8 = (uVar8 >> 0x10 ^ uVar8) * -0x7a143595;
        uVar8 = (uVar8 >> 0xd ^ uVar8) * -0x3d4d51cb;
        uVar8 = uVar8 >> 0x10 ^ uVar8;
        iVar19 = (uVar17 >> 0x10 ^ uVar17) + uVar18 + uVar14 + uVar8;
        puVar11 = local_6c;
        local_78 = (char *)CONCAT44(uVar18 + iVar19,iVar19);
        win = uVar14 + iVar19;
        local_6c[0] = uVar8 + iVar19;
        pcVar27 = __s + face->var_postscript_prefix_len;
        pcVar12 = pcVar27 + 0x20;
        *pcVar27 = '-';
        pcVar27[0x21] = '.';
        pcVar27[0x22] = '.';
        pcVar27[0x23] = '.';
        pcVar27[0x24] = '\0';
        iVar19 = 0;
        do {
          uVar8 = *puVar11;
          iVar21 = 8;
          do {
            *pcVar12 = "0123456789ABCDEF"[uVar8 & 0xf];
            pcVar12 = pcVar12 + -1;
            uVar8 = uVar8 >> 4;
            iVar21 = iVar21 + -1;
          } while (iVar21 != 0);
          iVar19 = iVar19 + 1;
          puVar11 = puVar11 + -1;
        } while (iVar19 != 4);
      }
    }
  }
LAB_00220db7:
  face->postscript_name = __s;
  return __s;
}

Assistant:

static const char*
  sfnt_get_ps_name( TT_Face  face )
  {
    FT_Int       found, win, apple;
    const char*  result = NULL;


    if ( face->postscript_name )
      return face->postscript_name;

#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
    if ( face->blend                                 &&
         ( FT_IS_NAMED_INSTANCE( FT_FACE( face ) ) ||
           FT_IS_VARIATION( FT_FACE( face ) )      ) )
    {
      face->postscript_name = sfnt_get_var_ps_name( face );
      return face->postscript_name;
    }
#endif

    /* scan the name table to see whether we have a Postscript name here, */
    /* either in Macintosh or Windows platform encodings                  */
    found = sfnt_get_name_id( face, TT_NAME_ID_PS_NAME, &win, &apple );
    if ( !found )
      return NULL;

    /* prefer Windows entries over Apple */
    if ( win != -1 )
      result = get_win_string( face->root.memory,
                               face->name_table.stream,
                               face->name_table.names + win,
                               sfnt_is_postscript,
                               1 );
    else
      result = get_apple_string( face->root.memory,
                                 face->name_table.stream,
                                 face->name_table.names + apple,
                                 sfnt_is_postscript,
                                 1 );

    face->postscript_name = result;

    return result;
  }